

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSort.cpp
# Opt level: O0

void maxHeapify(double *heap_v,HighsInt *heap_i,HighsInt i,HighsInt n)

{
  double dVar1;
  HighsInt HVar2;
  HighsInt temp_i;
  HighsInt j;
  double temp_v;
  HighsInt n_local;
  HighsInt i_local;
  HighsInt *heap_i_local;
  double *heap_v_local;
  
  dVar1 = heap_v[i];
  HVar2 = heap_i[i];
  j = i << 1;
  while (j <= n) {
    if ((j < n) && (heap_v[j] <= heap_v[j + 1] && heap_v[j + 1] != heap_v[j])) {
      j = j + 1;
    }
    if (heap_v[j] <= dVar1 && dVar1 != heap_v[j]) break;
    if (dVar1 <= heap_v[j]) {
      heap_v[j / 2] = heap_v[j];
      heap_i[j / 2] = heap_i[j];
      j = j << 1;
    }
  }
  heap_v[j / 2] = dVar1;
  heap_i[j / 2] = HVar2;
  return;
}

Assistant:

void maxHeapify(double* heap_v, HighsInt* heap_i, HighsInt i, HighsInt n) {
  double temp_v;
  HighsInt j, temp_i;
  temp_v = heap_v[i];
  temp_i = heap_i[i];
  j = 2 * i;
  while (j <= n) {
    if (j < n && heap_v[j + 1] > heap_v[j]) j = j + 1;
    if (temp_v > heap_v[j])
      break;
    else if (temp_v <= heap_v[j]) {
      heap_v[j / 2] = heap_v[j];
      heap_i[j / 2] = heap_i[j];
      j = 2 * j;
    }
  }
  heap_v[j / 2] = temp_v;
  heap_i[j / 2] = temp_i;
  return;
}